

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O3

void TestSuite::failHandler(void)

{
  string *psVar1;
  ostream *poVar2;
  
  psVar1 = getInfoMsg_abi_cxx11_();
  if (psVar1->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        info: ",0xe);
    psVar1 = getInfoMsg_abi_cxx11_();
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

static void failHandler() {
        if (!getInfoMsg().empty()) {
            std::cout << "        info: " << getInfoMsg() << std::endl;
        }
    }